

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pic.c
# Opt level: O3

void sysbvm_pic_flushSelector(sysbvm_pic_t *pic,sysbvm_tuple_t selector)

{
  undefined8 *puVar1;
  atomic_uint aVar2;
  long lVar3;
  bool bVar4;
  
  do {
    aVar2 = pic->preSequence;
    LOCK();
    bVar4 = aVar2 == pic->preSequence;
    if (bVar4) {
      pic->preSequence = aVar2 + 1;
    }
    UNLOCK();
  } while (!bVar4);
  lVar3 = 8;
  do {
    if (*(sysbvm_tuple_t *)((long)pic->entries + lVar3 + -8) == selector) {
      puVar1 = (undefined8 *)((long)pic->entries + lVar3 + -8);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x68);
  pic->postSequence = aVar2 + 1;
  return;
}

Assistant:

SYSBVM_API void sysbvm_pic_flushSelector(sysbvm_pic_t *pic, sysbvm_tuple_t selector)
{
    uint32_t sequence = sysbvm_pic_writeLock(pic);
    for(int i = 0; i < SYSBVM_PIC_ENTRY_COUNT; ++i)
    {
        sysbvm_picEntry_t *entry = pic->entries + i;
        if(entry->selector == selector)
            memset(entry, 0, sizeof(sysbvm_picEntry_t));
    }
    sysbvm_pic_writeUnlock(pic, sequence);
}